

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printMemBOption(MCInst *MI,uint OpNum,SStream *O)

{
  MCOperand *op;
  ulong uVar1;
  uint64_t uVar2;
  char *pcVar3;
  undefined4 in_register_00000034;
  char *s;
  bool bVar4;
  
  op = MCInst_getOperand(MI,0);
  uVar1 = MCOperand_getImm(op);
  uVar2 = ARM_getFeatureBits(MI->csh->mode);
  switch(uVar1 & 0xffffffff) {
  case 0:
    s = "#0x0";
    break;
  case 1:
    bVar4 = (uVar2 >> 0x2b & 1) != 0;
    pcVar3 = "#0x1";
    s = "oshld";
    goto LAB_00163a62;
  case 2:
    s = "oshst";
    break;
  case 3:
    s = "osh";
    break;
  case 4:
    s = "#0x4";
    break;
  case 5:
    bVar4 = (uVar2 >> 0x2b & 1) != 0;
    pcVar3 = "#0x5";
    s = "nshld";
    goto LAB_00163a62;
  case 6:
    s = "nshst";
    break;
  case 7:
    s = "nsh";
    break;
  case 8:
    s = "#0x8";
    break;
  case 9:
    bVar4 = (uVar2 >> 0x2b & 1) != 0;
    pcVar3 = "#0x9";
    s = "ishld";
    goto LAB_00163a62;
  case 10:
    s = "ishst";
    break;
  case 0xb:
    s = "ish";
    break;
  case 0xc:
    s = "#0xc";
    break;
  case 0xd:
    bVar4 = (uVar2 >> 0x2b & 1) != 0;
    pcVar3 = "#0xd";
    s = "ld";
LAB_00163a62:
    if (!bVar4) {
      s = pcVar3;
    }
    break;
  case 0xe:
    s = "st";
    break;
  case 0xf:
    s = "sy";
    break;
  default:
    s = "BUGBUG";
  }
  SStream_concat0((SStream *)CONCAT44(in_register_00000034,OpNum),s);
  if (MI->csh->detail != CS_OPT_OFF) {
    (MI->flat_insn->detail->field_6).x86.sse_cc = (int)uVar1 + X86_SSE_CC_EQ;
  }
  return;
}

Assistant:

static void printMemBOption(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned val = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	SStream_concat0(O, ARM_MB_MemBOptToString(val + 1,
				(ARM_getFeatureBits(MI->csh->mode) & ARM_HasV8Ops) != 0));

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.mem_barrier = (arm_mem_barrier)(val + 1);
	}
}